

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O1

int Frc_ObjFanoutsAreCos(Frc_Obj_t *pThis)

{
  long lVar1;
  
  if (0 < (long)(int)pThis->nFanouts) {
    lVar1 = 0;
    do {
      if (((&pThis->field_0x0)
           [(long)*(int *)(&pThis[1].field_0x0 + lVar1 * 4 + (ulong)(*(uint *)pThis >> 4) * 4) * 4]
          & 2) == 0) {
        return 0;
      }
      lVar1 = lVar1 + 1;
    } while ((int)pThis->nFanouts != lVar1);
  }
  return 1;
}

Assistant:

int Frc_ObjFanoutsAreCos( Frc_Obj_t * pThis )
{
    Frc_Obj_t * pNext;
    int i;
    Frc_ObjForEachFanout( pThis, pNext, i )
        if ( !Frc_ObjIsCo(pNext) )
            return 0;
    return 1;
}